

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O0

int CVmObjList::getp_val_which(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  undefined8 in_RCX;
  uint idx_00;
  char *in_RDX;
  vm_val_t *in_RSI;
  int *in_RDI;
  int idx;
  uint *in_stack_00000028;
  char *in_stack_00000030;
  vm_val_t *in_stack_00000038;
  vm_val_t *in_stack_00000040;
  
  idx_00 = (uint)((ulong)in_RCX >> 0x20);
  getp_index_which(in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  if (*in_RDI == 7) {
    index_list(in_RSI,in_RDX,idx_00);
  }
  return 1;
}

Assistant:

int CVmObjList::getp_val_which(VMG_ vm_val_t *retval,
                               const vm_val_t *self_val,
                               const char *lst, uint *argc)
{
    /* get the index of the value using indexWhich */
    getp_index_which(vmg_ retval, self_val, lst, argc);

    /* if the return value is a valid index, get the value at the index */
    if (retval->typ == VM_INT)
    {
        int idx;
        
        /* re-translate the list address in case of swapping */
        VM_IF_SWAPPING_POOL(if (self_val->typ == VM_LIST)
            lst = self_val->get_as_list(vmg0_);)

        /* get the element as the return value */
        idx = (int)retval->val.intval;
        index_list(vmg_ retval, lst, idx);
    }
    
    /* handled */
    return TRUE;
}